

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

optional<long> __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeI64(ParseInput *this)

{
  bool bVar1;
  Token *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  optional<long> oVar4;
  _Storage<unsigned_long,_true> local_78;
  optional<unsigned_long> n;
  optional<wasm::WATParser::Token> t;
  ParseInput *this_local;
  bool local_10;
  
  peek((optional<wasm::WATParser::Token> *)
       &n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged,this);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
  if (bVar1) {
    this_00 = std::optional<wasm::WATParser::Token>::operator->
                        ((optional<wasm::WATParser::Token> *)
                         &n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_engaged);
    oVar3 = Token::getI64(this_00);
    local_78._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_78);
    if (bVar1) {
      Lexer::operator++(&this->lexer);
      std::optional<long>::optional<unsigned_long,_true>
                ((optional<long> *)&this_local,(optional<unsigned_long> *)&local_78);
      bVar1 = true;
      goto LAB_01d85c3c;
    }
  }
  bVar1 = false;
LAB_01d85c3c:
  std::optional<wasm::WATParser::Token>::~optional
            ((optional<wasm::WATParser::Token> *)
             &n.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    std::optional<long>::optional((optional<long> *)&this_local);
    uVar2 = extraout_RDX_00;
  }
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)uVar2 >> 8);
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = local_10;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)this_local;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> takeI64() {
    if (auto t = peek()) {
      if (auto n = t->getI64()) {
        ++lexer;
        return n;
      }
    }
    return {};
  }